

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O0

void anurbs::TypeRegistry<anurbs::Model>::register_type<anurbs::NurbsSurfaceGeometry<3l>>
               (bool no_exception)

{
  bool bVar1;
  runtime_error *this;
  unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,std::default_delete<anurbs::TypeEntryBase<anurbs::Model>>>
  *this_00;
  unique_ptr<anurbs::TypeEntry<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::Model>,_std::default_delete<anurbs::TypeEntry<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::Model>_>_>
  local_60;
  undefined4 local_54;
  _Self local_50 [3];
  _Self local_38;
  undefined1 local_30 [8];
  string type;
  bool no_exception_local;
  
  type.field_2._M_local_buf[0xf] = no_exception;
  NurbsSurfaceGeometry<3l>::type_name_abi_cxx11_();
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
               *)s_registry_abi_cxx11_,(key_type *)local_30);
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
              *)s_registry_abi_cxx11_);
  bVar1 = std::operator!=(&local_38,local_50);
  if (bVar1) {
    if ((type.field_2._M_local_buf[0xf] & 1U) == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Entity already registered");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_54 = 1;
  }
  else {
    new_<anurbs::TypeEntry<anurbs::NurbsSurfaceGeometry<3l>,anurbs::Model>>();
    this_00 = (unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,std::default_delete<anurbs::TypeEntryBase<anurbs::Model>>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,_std::default_delete<anurbs::TypeEntryBase<anurbs::Model>_>_>_>_>_>
                               *)s_registry_abi_cxx11_,(key_type *)local_30);
    std::
    unique_ptr<anurbs::TypeEntryBase<anurbs::Model>,std::default_delete<anurbs::TypeEntryBase<anurbs::Model>>>
    ::operator=(this_00,&local_60);
    std::
    unique_ptr<anurbs::TypeEntry<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::Model>,_std::default_delete<anurbs::TypeEntry<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::Model>_>_>
    ::~unique_ptr(&local_60);
    local_54 = 0;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void register_type(bool no_exception)
    {
        const std::string type = TData::type_name();

        if (s_registry.find(type) != s_registry.end()) {
            if (no_exception) {
                return;
            }
            throw std::runtime_error("Entity already registered");
        }

        s_registry[type] = new_<TypeEntry<TData, TModel>>();
    }